

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# okiadpcm.c
# Opt level: O0

void oki_adpcm_init(oki_adpcm_state *adpcm,INT8 *custom_index_shift,INT16 *custom_diff_lookup)

{
  INT8 *local_28;
  INT16 *custom_diff_lookup_local;
  INT8 *custom_index_shift_local;
  oki_adpcm_state *adpcm_local;
  
  local_28 = custom_index_shift;
  if (custom_index_shift == (INT8 *)0x0) {
    local_28 = s_index_shift;
  }
  adpcm->index_shift = local_28;
  if (custom_diff_lookup == (INT16 *)0x0) {
    compute_tables();
    adpcm->diff_lookup = s_diff_lookup;
  }
  else {
    adpcm->diff_lookup = custom_diff_lookup;
  }
  oki_adpcm_reset(adpcm);
  return;
}

Assistant:

void oki_adpcm_init(oki_adpcm_state* adpcm, const INT8* custom_index_shift, const INT16* custom_diff_lookup)
{
	adpcm->index_shift =  (custom_index_shift != NULL) ? custom_index_shift : s_index_shift;
	if (custom_diff_lookup != NULL)
	{
		adpcm->diff_lookup = custom_diff_lookup;
	}
	else
	{
		compute_tables();
		adpcm->diff_lookup = s_diff_lookup;
	}
	oki_adpcm_reset(adpcm);
	
	return;
}